

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.h
# Opt level: O0

string_view * __thiscall absl::string_view::operator_cast_to_string(string_view *this)

{
  const_pointer pcVar1;
  size_type sVar2;
  string_view *in_RSI;
  allocator local_19 [9];
  string_view *this_local;
  
  this_local = this;
  pcVar1 = data(in_RSI);
  if (pcVar1 == (const_pointer)0x0) {
    std::__cxx11::string::string((string *)this);
  }
  else {
    pcVar1 = data(in_RSI);
    sVar2 = size(in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar1,sVar2,local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  return this;
}

Assistant:

explicit operator std::basic_string<char, traits_type, A>() const {
    if (!data()) return {};
    return std::basic_string<char, traits_type, A>(data(), size());
  }